

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Ref<embree::Geometry> *pRVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  RTCIntersectArguments *pRVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined4 uVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  bool bVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  AABBNodeMB4D *node1;
  ulong uVar115;
  ulong uVar116;
  long lVar117;
  int iVar118;
  long lVar119;
  uint uVar120;
  ulong uVar121;
  ulong uVar122;
  ulong uVar123;
  ulong uVar124;
  long lVar125;
  ulong uVar126;
  ulong uVar127;
  ulong uVar128;
  ulong uVar129;
  long lVar130;
  ulong unaff_R13;
  size_t mask;
  ulong uVar131;
  ulong uVar132;
  ulong uVar133;
  bool bVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar140;
  float fVar147;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined8 extraout_XMM1_Qa_00;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar146 [64];
  float fVar151;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  float fVar179;
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  float fVar186;
  undefined1 auVar182 [32];
  float fVar184;
  float fVar185;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar183 [64];
  undefined1 auVar190 [32];
  uint uVar192;
  uint uVar193;
  uint uVar194;
  uint uVar195;
  uint uVar196;
  uint uVar197;
  uint uVar198;
  undefined1 auVar191 [64];
  undefined1 auVar199 [32];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  float fVar202;
  undefined1 auVar203 [16];
  float fVar208;
  undefined1 auVar204 [32];
  float fVar206;
  float fVar207;
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar205 [64];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx::UVIdentity<8>_> hit;
  NodeRef stack [564];
  int local_176c;
  ulong local_1768;
  ulong local_1760;
  ulong local_1758;
  ulong local_1750;
  ulong local_1748;
  ulong local_1740;
  ulong local_1738;
  ulong *local_1730;
  Scene *local_1728;
  undefined1 local_1720 [32];
  ulong local_16f8;
  long local_16f0;
  ulong local_16e8;
  ulong local_16e0;
  ulong local_16d8;
  ulong local_16d0;
  ulong local_16c8;
  float local_16c0;
  float local_16bc;
  float local_16b8;
  float local_16b4;
  float local_16b0;
  undefined4 local_16ac;
  uint local_16a8;
  uint local_16a4;
  uint local_16a0;
  RTCFilterFunctionNArguments local_1690;
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [8];
  float fStack_15d8;
  float fStack_15d4;
  undefined1 local_15d0 [8];
  float fStack_15c8;
  float fStack_15c4;
  undefined1 local_15c0 [8];
  float fStack_15b8;
  float fStack_15b4;
  undefined1 local_15b0 [8];
  float fStack_15a8;
  float fStack_15a4;
  undefined1 local_15a0 [8];
  float fStack_1598;
  float fStack_1594;
  undefined1 local_1590 [8];
  float fStack_1588;
  float fStack_1584;
  undefined1 local_1580 [8];
  float fStack_1578;
  float fStack_1574;
  undefined1 local_1570 [8];
  float fStack_1568;
  float fStack_1564;
  undefined1 local_1560 [8];
  float fStack_1558;
  float fStack_1554;
  undefined1 local_1550 [8];
  float fStack_1548;
  float fStack_1544;
  undefined1 local_1540 [8];
  float fStack_1538;
  float fStack_1534;
  undefined1 local_1530 [16];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [8];
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  undefined4 uStack_13e4;
  undefined1 local_13e0 [32];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  undefined4 uStack_1204;
  ulong local_1200;
  ulong local_11f8 [569];
  undefined1 auVar163 [64];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar140 = ray->tfar;
    auVar174 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar140) {
      local_1730 = local_11f8;
      local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar5 = (ray->dir).field_0;
      auVar136 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar135._8_4_ = 0x7fffffff;
      auVar135._0_8_ = 0x7fffffff7fffffff;
      auVar135._12_4_ = 0x7fffffff;
      auVar135 = vandps_avx((undefined1  [16])aVar5,auVar135);
      auVar167._8_4_ = 0x219392ef;
      auVar167._0_8_ = 0x219392ef219392ef;
      auVar167._12_4_ = 0x219392ef;
      auVar135 = vcmpps_avx(auVar135,auVar167,1);
      auVar135 = vblendvps_avx((undefined1  [16])aVar5,auVar167,auVar135);
      auVar167 = vrcpps_avx(auVar135);
      fVar149 = auVar167._0_4_;
      auVar155._0_4_ = fVar149 * auVar135._0_4_;
      fVar151 = auVar167._4_4_;
      auVar155._4_4_ = fVar151 * auVar135._4_4_;
      fVar152 = auVar167._8_4_;
      auVar155._8_4_ = fVar152 * auVar135._8_4_;
      fVar153 = auVar167._12_4_;
      auVar155._12_4_ = fVar153 * auVar135._12_4_;
      auVar168._8_4_ = 0x3f800000;
      auVar168._0_8_ = &DAT_3f8000003f800000;
      auVar168._12_4_ = 0x3f800000;
      auVar135 = vsubps_avx(auVar168,auVar155);
      auVar156._0_4_ = fVar149 + fVar149 * auVar135._0_4_;
      auVar156._4_4_ = fVar151 + fVar151 * auVar135._4_4_;
      auVar156._8_4_ = fVar152 + fVar152 * auVar135._8_4_;
      auVar156._12_4_ = fVar153 + fVar153 * auVar135._12_4_;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_1440._4_4_ = uVar3;
      local_1440._0_4_ = uVar3;
      local_1440._8_4_ = uVar3;
      local_1440._12_4_ = uVar3;
      local_1440._16_4_ = uVar3;
      local_1440._20_4_ = uVar3;
      local_1440._24_4_ = uVar3;
      local_1440._28_4_ = uVar3;
      auVar176 = ZEXT3264(local_1440);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1460._4_4_ = uVar3;
      local_1460._0_4_ = uVar3;
      local_1460._8_4_ = uVar3;
      local_1460._12_4_ = uVar3;
      local_1460._16_4_ = uVar3;
      local_1460._20_4_ = uVar3;
      local_1460._24_4_ = uVar3;
      local_1460._28_4_ = uVar3;
      auVar178 = ZEXT3264(local_1460);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1480._4_4_ = uVar3;
      local_1480._0_4_ = uVar3;
      local_1480._8_4_ = uVar3;
      local_1480._12_4_ = uVar3;
      local_1480._16_4_ = uVar3;
      local_1480._20_4_ = uVar3;
      local_1480._24_4_ = uVar3;
      local_1480._28_4_ = uVar3;
      auVar183 = ZEXT3264(local_1480);
      auVar135 = vshufps_avx(auVar156,auVar156,0);
      local_14a0._16_16_ = auVar135;
      local_14a0._0_16_ = auVar135;
      auVar191 = ZEXT3264(local_14a0);
      auVar135 = vmovshdup_avx(auVar156);
      auVar166 = ZEXT1664(auVar135);
      auVar167 = vshufps_avx(auVar156,auVar156,0x55);
      local_14c0._16_16_ = auVar167;
      local_14c0._0_16_ = auVar167;
      auVar200 = ZEXT3264(local_14c0);
      auVar167 = vshufpd_avx(auVar156,auVar156,1);
      auVar172 = ZEXT1664(auVar167);
      auVar155 = vshufps_avx(auVar156,auVar156,0xaa);
      local_14e0._16_16_ = auVar155;
      local_14e0._0_16_ = auVar155;
      auVar201 = ZEXT3264(local_14e0);
      uVar122 = (ulong)(auVar156._0_4_ < 0.0) << 5;
      uVar124 = (ulong)(auVar135._0_4_ < 0.0) << 5 | 0x40;
      uVar126 = (ulong)(auVar167._0_4_ < 0.0) << 5 | 0x80;
      uVar128 = uVar122 ^ 0x20;
      uVar123 = uVar124 ^ 0x20;
      uVar133 = uVar126 ^ 0x20;
      auVar135 = vshufps_avx(auVar136,auVar136,0);
      local_1500._16_16_ = auVar135;
      local_1500._0_16_ = auVar135;
      auVar205 = ZEXT3264(local_1500);
      auVar135 = vshufps_avx(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),0);
      local_1520._16_16_ = auVar135;
      local_1520._0_16_ = auVar135;
      auVar213 = ZEXT3264(local_1520);
      local_1420._16_16_ = mm_lookupmask_ps._240_16_;
      local_1420._0_16_ = mm_lookupmask_ps._240_16_;
      local_13e0 = vperm2f128_avx(local_1420,mm_lookupmask_ps._0_32_,2);
      auVar146 = ZEXT3264(local_13e0);
      auVar137._8_4_ = 0xbf800000;
      auVar137._0_8_ = 0xbf800000bf800000;
      auVar137._12_4_ = 0xbf800000;
      auVar137._16_4_ = 0xbf800000;
      auVar137._20_4_ = 0xbf800000;
      auVar137._24_4_ = 0xbf800000;
      auVar137._28_4_ = 0xbf800000;
      auVar158._8_4_ = 0x3f800000;
      auVar158._0_8_ = &DAT_3f8000003f800000;
      auVar158._12_4_ = 0x3f800000;
      auVar158._16_4_ = 0x3f800000;
      auVar158._20_4_ = 0x3f800000;
      auVar158._24_4_ = 0x3f800000;
      auVar158._28_4_ = 0x3f800000;
      auVar163 = ZEXT3264(auVar158);
      _local_1400 = vblendvps_avx(auVar158,auVar137,local_13e0);
      local_1740 = uVar122;
      local_1748 = uVar124;
      local_1750 = uVar126;
      local_1758 = uVar128;
      local_1760 = uVar123;
      local_1768 = uVar133;
      do {
        if (local_1730 == &local_1200) {
          return;
        }
        uVar132 = local_1730[-1];
        local_1730 = local_1730 + -1;
        local_1738 = unaff_R13;
        do {
          if ((uVar132 & 8) == 0) {
            uVar115 = uVar132 & 0xfffffffffffffff0;
            fVar140 = (ray->dir).field_0.m128[3];
            auVar138._4_4_ = fVar140;
            auVar138._0_4_ = fVar140;
            auVar138._8_4_ = fVar140;
            auVar138._12_4_ = fVar140;
            auVar138._16_4_ = fVar140;
            auVar138._20_4_ = fVar140;
            auVar138._24_4_ = fVar140;
            auVar138._28_4_ = fVar140;
            pfVar2 = (float *)(uVar115 + 0x100 + uVar122);
            pfVar1 = (float *)(uVar115 + 0x40 + uVar122);
            auVar141._0_4_ = fVar140 * *pfVar2 + *pfVar1;
            auVar141._4_4_ = fVar140 * pfVar2[1] + pfVar1[1];
            auVar141._8_4_ = fVar140 * pfVar2[2] + pfVar1[2];
            auVar141._12_4_ = fVar140 * pfVar2[3] + pfVar1[3];
            auVar141._16_4_ = fVar140 * pfVar2[4] + pfVar1[4];
            auVar141._20_4_ = fVar140 * pfVar2[5] + pfVar1[5];
            auVar141._24_4_ = fVar140 * pfVar2[6] + pfVar1[6];
            auVar141._28_4_ = auVar146._28_4_ + pfVar1[7];
            auVar137 = vsubps_avx(auVar141,auVar176._0_32_);
            auVar78._4_4_ = auVar191._4_4_ * auVar137._4_4_;
            auVar78._0_4_ = auVar191._0_4_ * auVar137._0_4_;
            auVar78._8_4_ = auVar191._8_4_ * auVar137._8_4_;
            auVar78._12_4_ = auVar191._12_4_ * auVar137._12_4_;
            auVar78._16_4_ = auVar191._16_4_ * auVar137._16_4_;
            auVar78._20_4_ = auVar191._20_4_ * auVar137._20_4_;
            auVar78._24_4_ = auVar191._24_4_ * auVar137._24_4_;
            auVar78._28_4_ = auVar137._28_4_;
            pfVar2 = (float *)(uVar115 + 0x100 + uVar124);
            pfVar1 = (float *)(uVar115 + 0x40 + uVar124);
            auVar159._0_4_ = fVar140 * *pfVar2 + *pfVar1;
            auVar159._4_4_ = fVar140 * pfVar2[1] + pfVar1[1];
            auVar159._8_4_ = fVar140 * pfVar2[2] + pfVar1[2];
            auVar159._12_4_ = fVar140 * pfVar2[3] + pfVar1[3];
            auVar159._16_4_ = fVar140 * pfVar2[4] + pfVar1[4];
            auVar159._20_4_ = fVar140 * pfVar2[5] + pfVar1[5];
            auVar159._24_4_ = fVar140 * pfVar2[6] + pfVar1[6];
            auVar159._28_4_ = auVar163._28_4_ + pfVar1[7];
            auVar137 = vmaxps_avx(auVar205._0_32_,auVar78);
            auVar158 = vsubps_avx(auVar159,auVar178._0_32_);
            pfVar2 = (float *)(uVar115 + 0x100 + uVar126);
            auVar79._4_4_ = auVar200._4_4_ * auVar158._4_4_;
            auVar79._0_4_ = auVar200._0_4_ * auVar158._0_4_;
            auVar79._8_4_ = auVar200._8_4_ * auVar158._8_4_;
            auVar79._12_4_ = auVar200._12_4_ * auVar158._12_4_;
            auVar79._16_4_ = auVar200._16_4_ * auVar158._16_4_;
            auVar79._20_4_ = auVar200._20_4_ * auVar158._20_4_;
            auVar79._24_4_ = auVar200._24_4_ * auVar158._24_4_;
            auVar79._28_4_ = auVar158._28_4_;
            pfVar1 = (float *)(uVar115 + 0x40 + uVar126);
            auVar164._0_4_ = fVar140 * *pfVar2 + *pfVar1;
            auVar164._4_4_ = fVar140 * pfVar2[1] + pfVar1[1];
            auVar164._8_4_ = fVar140 * pfVar2[2] + pfVar1[2];
            auVar164._12_4_ = fVar140 * pfVar2[3] + pfVar1[3];
            auVar164._16_4_ = fVar140 * pfVar2[4] + pfVar1[4];
            auVar164._20_4_ = fVar140 * pfVar2[5] + pfVar1[5];
            auVar164._24_4_ = fVar140 * pfVar2[6] + pfVar1[6];
            auVar164._28_4_ = auVar166._28_4_ + pfVar1[7];
            auVar158 = vsubps_avx(auVar164,auVar183._0_32_);
            auVar80._4_4_ = auVar201._4_4_ * auVar158._4_4_;
            auVar80._0_4_ = auVar201._0_4_ * auVar158._0_4_;
            auVar80._8_4_ = auVar201._8_4_ * auVar158._8_4_;
            auVar80._12_4_ = auVar201._12_4_ * auVar158._12_4_;
            auVar80._16_4_ = auVar201._16_4_ * auVar158._16_4_;
            auVar80._20_4_ = auVar201._20_4_ * auVar158._20_4_;
            fVar149 = auVar158._28_4_;
            auVar80._24_4_ = auVar201._24_4_ * auVar158._24_4_;
            auVar80._28_4_ = fVar149;
            auVar158 = vmaxps_avx(auVar79,auVar80);
            pfVar2 = (float *)(uVar115 + 0x100 + uVar128);
            auVar137 = vmaxps_avx(auVar137,auVar158);
            pfVar1 = (float *)(uVar115 + 0x40 + uVar128);
            auVar160._0_4_ = fVar140 * *pfVar2 + *pfVar1;
            auVar160._4_4_ = fVar140 * pfVar2[1] + pfVar1[1];
            auVar160._8_4_ = fVar140 * pfVar2[2] + pfVar1[2];
            auVar160._12_4_ = fVar140 * pfVar2[3] + pfVar1[3];
            auVar160._16_4_ = fVar140 * pfVar2[4] + pfVar1[4];
            auVar160._20_4_ = fVar140 * pfVar2[5] + pfVar1[5];
            auVar160._24_4_ = fVar140 * pfVar2[6] + pfVar1[6];
            auVar160._28_4_ = fVar149 + pfVar1[7];
            auVar158 = vsubps_avx(auVar160,auVar176._0_32_);
            auVar81._4_4_ = auVar191._4_4_ * auVar158._4_4_;
            auVar81._0_4_ = auVar191._0_4_ * auVar158._0_4_;
            auVar81._8_4_ = auVar191._8_4_ * auVar158._8_4_;
            auVar81._12_4_ = auVar191._12_4_ * auVar158._12_4_;
            auVar81._16_4_ = auVar191._16_4_ * auVar158._16_4_;
            auVar81._20_4_ = auVar191._20_4_ * auVar158._20_4_;
            auVar81._24_4_ = auVar191._24_4_ * auVar158._24_4_;
            auVar81._28_4_ = auVar158._28_4_;
            auVar158 = vminps_avx(auVar213._0_32_,auVar81);
            pfVar2 = (float *)(uVar115 + 0x100 + uVar123);
            pfVar1 = (float *)(uVar115 + 0x40 + uVar123);
            auVar165._0_4_ = fVar140 * *pfVar2 + *pfVar1;
            auVar165._4_4_ = fVar140 * pfVar2[1] + pfVar1[1];
            auVar165._8_4_ = fVar140 * pfVar2[2] + pfVar1[2];
            auVar165._12_4_ = fVar140 * pfVar2[3] + pfVar1[3];
            auVar165._16_4_ = fVar140 * pfVar2[4] + pfVar1[4];
            auVar165._20_4_ = fVar140 * pfVar2[5] + pfVar1[5];
            auVar165._24_4_ = fVar140 * pfVar2[6] + pfVar1[6];
            auVar165._28_4_ = fVar149 + pfVar1[7];
            auVar78 = vsubps_avx(auVar165,auVar178._0_32_);
            auVar82._4_4_ = auVar200._4_4_ * auVar78._4_4_;
            auVar82._0_4_ = auVar200._0_4_ * auVar78._0_4_;
            auVar82._8_4_ = auVar200._8_4_ * auVar78._8_4_;
            auVar82._12_4_ = auVar200._12_4_ * auVar78._12_4_;
            auVar82._16_4_ = auVar200._16_4_ * auVar78._16_4_;
            auVar82._20_4_ = auVar200._20_4_ * auVar78._20_4_;
            auVar82._24_4_ = auVar200._24_4_ * auVar78._24_4_;
            auVar82._28_4_ = auVar78._28_4_;
            pfVar2 = (float *)(uVar115 + 0x100 + uVar133);
            pfVar1 = (float *)(uVar115 + 0x40 + uVar133);
            auVar169._0_4_ = fVar140 * *pfVar2 + *pfVar1;
            auVar169._4_4_ = fVar140 * pfVar2[1] + pfVar1[1];
            auVar169._8_4_ = fVar140 * pfVar2[2] + pfVar1[2];
            auVar169._12_4_ = fVar140 * pfVar2[3] + pfVar1[3];
            auVar169._16_4_ = fVar140 * pfVar2[4] + pfVar1[4];
            auVar169._20_4_ = fVar140 * pfVar2[5] + pfVar1[5];
            auVar169._24_4_ = fVar140 * pfVar2[6] + pfVar1[6];
            auVar169._28_4_ = auVar172._28_4_ + pfVar1[7];
            auVar78 = vsubps_avx(auVar169,auVar183._0_32_);
            auVar86._4_4_ = auVar201._4_4_ * auVar78._4_4_;
            auVar86._0_4_ = auVar201._0_4_ * auVar78._0_4_;
            auVar86._8_4_ = auVar201._8_4_ * auVar78._8_4_;
            auVar86._12_4_ = auVar201._12_4_ * auVar78._12_4_;
            auVar86._16_4_ = auVar201._16_4_ * auVar78._16_4_;
            auVar86._20_4_ = auVar201._20_4_ * auVar78._20_4_;
            auVar86._24_4_ = auVar201._24_4_ * auVar78._24_4_;
            auVar86._28_4_ = auVar78._28_4_;
            auVar172 = ZEXT3264(auVar86);
            auVar78 = vminps_avx(auVar82,auVar86);
            auVar166 = ZEXT3264(auVar78);
            auVar158 = vminps_avx(auVar158,auVar78);
            auVar137 = vcmpps_avx(auVar137,auVar158,2);
            auVar146 = ZEXT3264(auVar137);
            if (((uint)uVar132 & 7) == 6) {
              auVar158 = vcmpps_avx(*(undefined1 (*) [32])(uVar115 + 0x1c0),auVar138,2);
              auVar78 = vcmpps_avx(auVar138,*(undefined1 (*) [32])(uVar115 + 0x1e0),1);
              auVar78 = vandps_avx(auVar158,auVar78);
              auVar137 = vandps_avx(auVar78,auVar137);
              auVar146 = ZEXT1664(auVar137._16_16_);
              auVar135 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
            }
            else {
              auVar135 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
            }
            auVar163 = ZEXT3264(auVar158);
            auVar135 = vpsllw_avx(auVar135,0xf);
            auVar135 = vpacksswb_avx(auVar135,auVar135);
            local_1738 = (ulong)(byte)(SUB161(auVar135 >> 7,0) & 1 |
                                       (SUB161(auVar135 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar135 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar135 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar135 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar135 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar135 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar135 >> 0x3f,0) << 7);
          }
          if ((uVar132 & 8) == 0) {
            if (local_1738 == 0) {
              iVar118 = 4;
            }
            else {
              uVar115 = uVar132 & 0xfffffffffffffff0;
              lVar119 = 0;
              if (local_1738 != 0) {
                for (; (local_1738 >> lVar119 & 1) == 0; lVar119 = lVar119 + 1) {
                }
              }
              iVar118 = 0;
              uVar132 = *(ulong *)(uVar115 + lVar119 * 8);
              uVar121 = local_1738 - 1 & local_1738;
              if (uVar121 != 0) {
                *local_1730 = uVar132;
                lVar119 = 0;
                if (uVar121 != 0) {
                  for (; (uVar121 >> lVar119 & 1) == 0; lVar119 = lVar119 + 1) {
                  }
                }
                uVar116 = uVar121 - 1;
                while( true ) {
                  local_1730 = local_1730 + 1;
                  uVar132 = *(ulong *)(uVar115 + lVar119 * 8);
                  uVar116 = uVar116 & uVar121;
                  if (uVar116 == 0) break;
                  *local_1730 = uVar132;
                  lVar119 = 0;
                  if (uVar116 != 0) {
                    for (; (uVar116 >> lVar119 & 1) == 0; lVar119 = lVar119 + 1) {
                    }
                  }
                  uVar121 = uVar116 - 1;
                }
                iVar118 = 0;
              }
            }
          }
          else {
            iVar118 = 6;
          }
        } while (iVar118 == 0);
        if (iVar118 == 6) {
          iVar118 = 0;
          local_16f8 = (ulong)((uint)uVar132 & 0xf) - 8;
          bVar134 = local_16f8 != 0;
          if (bVar134) {
            uVar132 = uVar132 & 0xfffffffffffffff0;
            local_1728 = context->scene;
            uVar123 = 0;
            do {
              local_16c8 = uVar123;
              lVar117 = uVar123 * 0x60;
              pRVar8 = (local_1728->geometries).items;
              pGVar9 = pRVar8[*(uint *)(uVar132 + 0x40 + lVar117)].ptr;
              fVar140 = (pGVar9->time_range).lower;
              fVar140 = pGVar9->fnumTimeSegments *
                        (((ray->dir).field_0.m128[3] - fVar140) /
                        ((pGVar9->time_range).upper - fVar140));
              auVar135 = vroundss_avx(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),9);
              auVar135 = vminss_avx(auVar135,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
              auVar13 = vmaxss_avx(auVar174._0_16_,auVar135);
              iVar118 = (int)auVar13._0_4_;
              lVar125 = (long)iVar118 * 0x38;
              lVar119 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar125);
              local_16e0 = (ulong)*(uint *)(uVar132 + 4 + lVar117);
              auVar135 = *(undefined1 (*) [16])(lVar119 + (ulong)*(uint *)(uVar132 + lVar117) * 4);
              uVar124 = (ulong)*(uint *)(uVar132 + 0x10 + lVar117);
              auVar136 = *(undefined1 (*) [16])(lVar119 + uVar124 * 4);
              uVar126 = (ulong)*(uint *)(uVar132 + 0x20 + lVar117);
              auVar167 = *(undefined1 (*) [16])(lVar119 + uVar126 * 4);
              uVar128 = (ulong)*(uint *)(uVar132 + 0x30 + lVar117);
              auVar155 = *(undefined1 (*) [16])(lVar119 + uVar128 * 4);
              local_16f0 = *(long *)&pRVar8[*(uint *)(uVar132 + 0x44 + lVar117)].ptr[2].
                                     numPrimitives;
              lVar119 = *(long *)(local_16f0 + lVar125);
              auVar156 = *(undefined1 (*) [16])(lVar119 + local_16e0 * 4);
              local_16d0 = (ulong)*(uint *)(uVar132 + 0x14 + lVar117);
              auVar168 = *(undefined1 (*) [16])(lVar119 + local_16d0 * 4);
              uVar133 = (ulong)*(uint *)(uVar132 + 0x24 + lVar117);
              auVar203 = *(undefined1 (*) [16])(lVar119 + uVar133 * 4);
              uVar115 = (ulong)*(uint *)(uVar132 + 0x34 + lVar117);
              auVar157 = *(undefined1 (*) [16])(lVar119 + uVar115 * 4);
              lVar119 = *(long *)&pRVar8[*(uint *)(uVar132 + 0x48 + lVar117)].ptr[2].numPrimitives;
              lVar10 = *(long *)(lVar119 + lVar125);
              uVar121 = (ulong)*(uint *)(uVar132 + 8 + lVar117);
              auVar180 = *(undefined1 (*) [16])(lVar10 + uVar121 * 4);
              uVar131 = (ulong)*(uint *)(uVar132 + 0x18 + lVar117);
              auVar216 = *(undefined1 (*) [16])(lVar10 + uVar131 * 4);
              local_16e8 = (ulong)*(uint *)(uVar132 + 0x28 + lVar117);
              auVar214 = *(undefined1 (*) [16])(lVar10 + local_16e8 * 4);
              local_16d8 = (ulong)*(uint *)(uVar132 + 0x38 + lVar117);
              auVar6 = *(undefined1 (*) [16])(lVar10 + local_16d8 * 4);
              fVar140 = fVar140 - auVar13._0_4_;
              local_1530 = ZEXT416((uint)fVar140);
              lVar10 = *(long *)&pRVar8[*(uint *)(uVar132 + 0x4c + lVar117)].ptr[2].numPrimitives;
              lVar125 = *(long *)(lVar10 + lVar125);
              uVar122 = (ulong)*(uint *)(uVar132 + 0xc + lVar117);
              auVar13 = *(undefined1 (*) [16])(lVar125 + uVar122 * 4);
              uVar129 = (ulong)*(uint *)(uVar132 + 0x1c + lVar117);
              auVar7 = *(undefined1 (*) [16])(lVar125 + uVar129 * 4);
              auVar83 = vunpcklps_avx(auVar135,auVar180);
              auVar180 = vunpckhps_avx(auVar135,auVar180);
              auVar84 = vunpcklps_avx(auVar156,auVar13);
              auVar156 = vunpckhps_avx(auVar156,auVar13);
              uVar116 = (ulong)*(uint *)(uVar132 + 0x2c + lVar117);
              auVar135 = *(undefined1 (*) [16])(lVar125 + uVar116 * 4);
              _local_1550 = vunpcklps_avx(auVar180,auVar156);
              auVar113 = _local_1550;
              _local_1590 = vunpcklps_avx(auVar83,auVar84);
              auVar109 = _local_1590;
              _local_1570 = vunpckhps_avx(auVar83,auVar84);
              auVar111 = _local_1570;
              auVar180 = vunpcklps_avx(auVar136,auVar216);
              auVar156 = vunpckhps_avx(auVar136,auVar216);
              auVar216 = vunpcklps_avx(auVar168,auVar7);
              auVar168 = vunpckhps_avx(auVar168,auVar7);
              uVar127 = (ulong)*(uint *)(uVar132 + 0x3c + lVar117);
              auVar136 = *(undefined1 (*) [16])(lVar125 + uVar127 * 4);
              _local_1540 = vunpcklps_avx(auVar156,auVar168);
              auVar114 = _local_1540;
              _local_1580 = vunpcklps_avx(auVar180,auVar216);
              auVar110 = _local_1580;
              _local_1560 = vunpckhps_avx(auVar180,auVar216);
              auVar112 = _local_1560;
              auVar168 = vunpcklps_avx(auVar167,auVar214);
              auVar167 = vunpckhps_avx(auVar167,auVar214);
              auVar180 = vunpcklps_avx(auVar203,auVar135);
              auVar156 = vunpckhps_avx(auVar203,auVar135);
              lVar130 = (long)(iVar118 + 1) * 0x38;
              lVar125 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar130);
              auVar135 = *(undefined1 (*) [16])(lVar125 + (ulong)*(uint *)(uVar132 + lVar117) * 4);
              _local_15a0 = vunpcklps_avx(auVar167,auVar156);
              auVar108 = _local_15a0;
              _local_15e0 = vunpcklps_avx(auVar168,auVar180);
              auVar104 = _local_15e0;
              _local_15c0 = vunpckhps_avx(auVar168,auVar180);
              auVar106 = _local_15c0;
              auVar156 = vunpcklps_avx(auVar155,auVar6);
              auVar167 = vunpckhps_avx(auVar155,auVar6);
              auVar168 = vunpcklps_avx(auVar157,auVar136);
              auVar155 = vunpckhps_avx(auVar157,auVar136);
              lVar119 = *(long *)(lVar119 + lVar130);
              auVar136 = *(undefined1 (*) [16])(lVar119 + uVar121 * 4);
              _local_15b0 = vunpcklps_avx(auVar167,auVar155);
              auVar107 = _local_15b0;
              auVar203 = vunpcklps_avx(auVar156,auVar168);
              _local_15d0 = vunpckhps_avx(auVar156,auVar168);
              auVar105 = _local_15d0;
              lVar11 = *(long *)(local_16f0 + lVar130);
              auVar155 = vunpcklps_avx(auVar135,auVar136);
              auVar167 = vunpckhps_avx(auVar135,auVar136);
              auVar135 = *(undefined1 (*) [16])(lVar11 + local_16e0 * 4);
              lVar10 = *(long *)(lVar10 + lVar130);
              auVar136 = *(undefined1 (*) [16])(lVar10 + uVar122 * 4);
              auVar156 = vunpcklps_avx(auVar135,auVar136);
              auVar135 = vunpckhps_avx(auVar135,auVar136);
              auVar157 = vunpcklps_avx(auVar167,auVar135);
              auVar180 = vunpcklps_avx(auVar155,auVar156);
              auVar167 = vunpckhps_avx(auVar155,auVar156);
              auVar135 = *(undefined1 (*) [16])(lVar125 + uVar124 * 4);
              auVar136 = *(undefined1 (*) [16])(lVar119 + uVar131 * 4);
              auVar156 = vunpcklps_avx(auVar135,auVar136);
              auVar155 = vunpckhps_avx(auVar135,auVar136);
              auVar135 = *(undefined1 (*) [16])(lVar11 + local_16d0 * 4);
              auVar136 = *(undefined1 (*) [16])(lVar10 + uVar129 * 4);
              auVar168 = vunpcklps_avx(auVar135,auVar136);
              auVar135 = vunpckhps_avx(auVar135,auVar136);
              auVar216 = vunpcklps_avx(auVar155,auVar135);
              auVar214 = vunpcklps_avx(auVar156,auVar168);
              auVar155 = vunpckhps_avx(auVar156,auVar168);
              auVar135 = *(undefined1 (*) [16])(lVar125 + uVar126 * 4);
              auVar136 = *(undefined1 (*) [16])(lVar119 + local_16e8 * 4);
              auVar168 = vunpcklps_avx(auVar135,auVar136);
              auVar156 = vunpckhps_avx(auVar135,auVar136);
              auVar135 = *(undefined1 (*) [16])(lVar11 + uVar133 * 4);
              auVar136 = *(undefined1 (*) [16])(lVar10 + uVar116 * 4);
              auVar6 = vunpcklps_avx(auVar135,auVar136);
              auVar135 = vunpckhps_avx(auVar135,auVar136);
              auVar13 = vunpcklps_avx(auVar156,auVar135);
              auVar7 = vunpcklps_avx(auVar168,auVar6);
              auVar156 = vunpckhps_avx(auVar168,auVar6);
              auVar135 = *(undefined1 (*) [16])(lVar125 + uVar128 * 4);
              auVar136 = *(undefined1 (*) [16])(lVar119 + local_16d8 * 4);
              auVar6 = vunpcklps_avx(auVar135,auVar136);
              auVar168 = vunpckhps_avx(auVar135,auVar136);
              auVar135 = *(undefined1 (*) [16])(lVar11 + uVar115 * 4);
              auVar136 = *(undefined1 (*) [16])(lVar10 + uVar127 * 4);
              auVar83 = vunpcklps_avx(auVar135,auVar136);
              auVar135 = vunpckhps_avx(auVar135,auVar136);
              auVar84 = vunpcklps_avx(auVar168,auVar135);
              auVar85 = vunpcklps_avx(auVar6,auVar83);
              auVar168 = vunpckhps_avx(auVar6,auVar83);
              auVar135 = vshufps_avx(local_1530,local_1530,0);
              auVar136 = ZEXT416((uint)(1.0 - fVar140));
              auVar136 = vshufps_avx(auVar136,auVar136,0);
              fVar140 = auVar135._0_4_;
              fVar149 = auVar135._4_4_;
              fVar151 = auVar135._8_4_;
              fVar152 = auVar135._12_4_;
              fVar153 = auVar136._0_4_;
              fVar154 = auVar136._4_4_;
              fVar148 = auVar136._8_4_;
              fVar150 = auVar136._12_4_;
              auVar170._4_4_ = fVar154 * (float)local_1590._4_4_ + auVar180._4_4_ * fVar149;
              auVar170._0_4_ = fVar153 * (float)local_1590._0_4_ + auVar180._0_4_ * fVar140;
              auVar170._8_4_ = fVar148 * fStack_1588 + auVar180._8_4_ * fVar151;
              auVar170._12_4_ = fVar150 * fStack_1584 + auVar180._12_4_ * fVar152;
              auVar173._4_4_ = fVar154 * (float)local_1570._4_4_ + auVar167._4_4_ * fVar149;
              auVar173._0_4_ = fVar153 * (float)local_1570._0_4_ + auVar167._0_4_ * fVar140;
              auVar173._8_4_ = fVar148 * fStack_1568 + auVar167._8_4_ * fVar151;
              auVar173._12_4_ = fVar150 * fStack_1564 + auVar167._12_4_ * fVar152;
              auVar177._4_4_ = fVar154 * (float)local_1550._4_4_ + auVar157._4_4_ * fVar149;
              auVar177._0_4_ = fVar153 * (float)local_1550._0_4_ + auVar157._0_4_ * fVar140;
              auVar177._8_4_ = fVar148 * fStack_1548 + auVar157._8_4_ * fVar151;
              auVar177._12_4_ = fVar150 * fStack_1544 + auVar157._12_4_ * fVar152;
              auVar180._0_4_ = fVar153 * (float)local_1580._0_4_ + fVar140 * auVar214._0_4_;
              auVar180._4_4_ = fVar154 * (float)local_1580._4_4_ + fVar149 * auVar214._4_4_;
              auVar180._8_4_ = fVar148 * fStack_1578 + fVar151 * auVar214._8_4_;
              auVar180._12_4_ = fVar150 * fStack_1574 + fVar152 * auVar214._12_4_;
              auVar157._0_4_ = fVar153 * (float)local_1560._0_4_ + fVar140 * auVar155._0_4_;
              auVar157._4_4_ = fVar154 * (float)local_1560._4_4_ + fVar149 * auVar155._4_4_;
              auVar157._8_4_ = fVar148 * fStack_1558 + fVar151 * auVar155._8_4_;
              auVar157._12_4_ = fVar150 * fStack_1554 + fVar152 * auVar155._12_4_;
              auVar214._0_4_ = fVar153 * (float)local_1540._0_4_ + auVar216._0_4_ * fVar140;
              auVar214._4_4_ = fVar154 * (float)local_1540._4_4_ + auVar216._4_4_ * fVar149;
              auVar214._8_4_ = fVar148 * fStack_1538 + auVar216._8_4_ * fVar151;
              auVar214._12_4_ = fVar150 * fStack_1534 + auVar216._12_4_ * fVar152;
              auVar170._20_4_ = fVar154 * (float)local_15e0._4_4_ + fVar149 * auVar7._4_4_;
              auVar170._16_4_ = fVar153 * (float)local_15e0._0_4_ + fVar140 * auVar7._0_4_;
              auVar170._24_4_ = fVar148 * fStack_15d8 + fVar151 * auVar7._8_4_;
              auVar170._28_4_ = fVar150 * fStack_15d4 + fVar152 * auVar7._12_4_;
              auVar173._20_4_ = fVar154 * (float)local_15c0._4_4_ + auVar156._4_4_ * fVar149;
              auVar173._16_4_ = fVar153 * (float)local_15c0._0_4_ + auVar156._0_4_ * fVar140;
              auVar173._24_4_ = fVar148 * fStack_15b8 + auVar156._8_4_ * fVar151;
              auVar173._28_4_ = fVar150 * fStack_15b4 + auVar156._12_4_ * fVar152;
              auVar177._20_4_ = fVar154 * (float)local_15a0._4_4_ + auVar13._4_4_ * fVar149;
              auVar177._16_4_ = fVar153 * (float)local_15a0._0_4_ + auVar13._0_4_ * fVar140;
              auVar177._24_4_ = fVar148 * fStack_1598 + auVar13._8_4_ * fVar151;
              auVar177._28_4_ = fVar150 * fStack_1594 + auVar13._12_4_ * fVar152;
              auVar216._0_4_ = auVar203._0_4_ * fVar153 + fVar140 * auVar85._0_4_;
              auVar216._4_4_ = auVar203._4_4_ * fVar154 + fVar149 * auVar85._4_4_;
              auVar216._8_4_ = auVar203._8_4_ * fVar148 + fVar151 * auVar85._8_4_;
              auVar216._12_4_ = auVar203._12_4_ * fVar150 + fVar152 * auVar85._12_4_;
              lVar119 = uVar132 + 0x40 + lVar117;
              local_13a0 = *(undefined8 *)(lVar119 + 0x10);
              uStack_1398 = *(undefined8 *)(lVar119 + 0x18);
              uStack_1390 = local_13a0;
              uStack_1388 = uStack_1398;
              lVar117 = uVar132 + 0x50 + lVar117;
              local_13c0 = *(undefined8 *)(lVar117 + 0x10);
              uStack_13b8 = *(undefined8 *)(lVar117 + 0x18);
              auVar203._0_4_ = fVar153 * (float)local_15d0._0_4_ + fVar140 * auVar168._0_4_;
              auVar203._4_4_ = fVar154 * (float)local_15d0._4_4_ + fVar149 * auVar168._4_4_;
              auVar203._8_4_ = fVar148 * fStack_15c8 + fVar151 * auVar168._8_4_;
              auVar203._12_4_ = fVar150 * fStack_15c4 + fVar152 * auVar168._12_4_;
              auVar136._0_4_ = fVar153 * (float)local_15b0._0_4_ + fVar140 * auVar84._0_4_;
              auVar136._4_4_ = fVar154 * (float)local_15b0._4_4_ + fVar149 * auVar84._4_4_;
              auVar136._8_4_ = fVar148 * fStack_15a8 + fVar151 * auVar84._8_4_;
              auVar136._12_4_ = fVar150 * fStack_15a4 + fVar152 * auVar84._12_4_;
              uStack_13b0 = local_13c0;
              uStack_13a8 = uStack_13b8;
              auVar142._16_16_ = auVar180;
              auVar142._0_16_ = auVar180;
              auVar161._16_16_ = auVar157;
              auVar161._0_16_ = auVar157;
              auVar181._16_16_ = auVar214;
              auVar181._0_16_ = auVar214;
              auVar190._16_16_ = auVar216;
              auVar190._0_16_ = auVar216;
              auVar199._16_16_ = auVar203;
              auVar199._0_16_ = auVar203;
              auVar139._16_16_ = auVar136;
              auVar139._0_16_ = auVar136;
              local_1720 = vsubps_avx(auVar170,auVar142);
              local_1660 = vsubps_avx(auVar173,auVar161);
              auVar137 = vsubps_avx(auVar177,auVar181);
              auVar158 = vsubps_avx(auVar190,auVar170);
              auVar78 = vsubps_avx(auVar199,auVar173);
              auVar79 = vsubps_avx(auVar139,auVar177);
              fVar152 = auVar79._0_4_;
              fVar202 = local_1660._0_4_;
              fVar18 = auVar79._4_4_;
              fVar206 = local_1660._4_4_;
              auVar87._4_4_ = fVar206 * fVar18;
              auVar87._0_4_ = fVar202 * fVar152;
              fVar28 = auVar79._8_4_;
              fVar207 = local_1660._8_4_;
              auVar87._8_4_ = fVar207 * fVar28;
              fVar38 = auVar79._12_4_;
              fVar208 = local_1660._12_4_;
              auVar87._12_4_ = fVar208 * fVar38;
              fVar48 = auVar79._16_4_;
              fVar209 = local_1660._16_4_;
              auVar87._16_4_ = fVar209 * fVar48;
              fVar58 = auVar79._20_4_;
              fVar210 = local_1660._20_4_;
              auVar87._20_4_ = fVar210 * fVar58;
              fVar68 = auVar79._24_4_;
              fVar211 = local_1660._24_4_;
              auVar87._24_4_ = fVar211 * fVar68;
              auVar87._28_4_ = auVar136._12_4_;
              fVar153 = auVar78._0_4_;
              fVar179 = auVar137._0_4_;
              fVar19 = auVar78._4_4_;
              fVar184 = auVar137._4_4_;
              auVar88._4_4_ = fVar184 * fVar19;
              auVar88._0_4_ = fVar179 * fVar153;
              fVar29 = auVar78._8_4_;
              fVar185 = auVar137._8_4_;
              auVar88._8_4_ = fVar185 * fVar29;
              fVar39 = auVar78._12_4_;
              fVar186 = auVar137._12_4_;
              auVar88._12_4_ = fVar186 * fVar39;
              fVar49 = auVar78._16_4_;
              fVar187 = auVar137._16_4_;
              auVar88._16_4_ = fVar187 * fVar49;
              fVar59 = auVar78._20_4_;
              fVar188 = auVar137._20_4_;
              auVar88._20_4_ = fVar188 * fVar59;
              fVar69 = auVar78._24_4_;
              fVar189 = auVar137._24_4_;
              auVar88._24_4_ = fVar189 * fVar69;
              auVar88._28_4_ = auVar180._12_4_;
              local_1600 = vsubps_avx(auVar88,auVar87);
              fVar154 = auVar158._0_4_;
              fVar20 = auVar158._4_4_;
              auVar90._4_4_ = fVar184 * fVar20;
              auVar90._0_4_ = fVar179 * fVar154;
              fVar30 = auVar158._8_4_;
              auVar90._8_4_ = fVar185 * fVar30;
              fVar40 = auVar158._12_4_;
              auVar90._12_4_ = fVar186 * fVar40;
              fVar50 = auVar158._16_4_;
              auVar90._16_4_ = fVar187 * fVar50;
              fVar60 = auVar158._20_4_;
              auVar90._20_4_ = fVar188 * fVar60;
              fVar70 = auVar158._24_4_;
              uVar89 = local_1600._28_4_;
              auVar90._24_4_ = fVar189 * fVar70;
              auVar90._28_4_ = uVar89;
              fVar148 = local_1720._0_4_;
              fVar21 = local_1720._4_4_;
              auVar91._4_4_ = fVar18 * fVar21;
              auVar91._0_4_ = fVar152 * fVar148;
              fVar31 = local_1720._8_4_;
              auVar91._8_4_ = fVar28 * fVar31;
              fVar41 = local_1720._12_4_;
              auVar91._12_4_ = fVar38 * fVar41;
              fVar51 = local_1720._16_4_;
              auVar91._16_4_ = fVar48 * fVar51;
              fVar61 = local_1720._20_4_;
              auVar91._20_4_ = fVar58 * fVar61;
              fVar71 = local_1720._24_4_;
              auVar91._24_4_ = fVar68 * fVar71;
              auVar91._28_4_ = auVar157._12_4_;
              auVar137 = vsubps_avx(auVar91,auVar90);
              auVar92._4_4_ = fVar19 * fVar21;
              auVar92._0_4_ = fVar153 * fVar148;
              auVar92._8_4_ = fVar29 * fVar31;
              auVar92._12_4_ = fVar39 * fVar41;
              auVar92._16_4_ = fVar49 * fVar51;
              auVar92._20_4_ = fVar59 * fVar61;
              auVar92._24_4_ = fVar69 * fVar71;
              auVar92._28_4_ = uVar89;
              auVar93._4_4_ = fVar206 * fVar20;
              auVar93._0_4_ = fVar202 * fVar154;
              auVar93._8_4_ = fVar207 * fVar30;
              auVar93._12_4_ = fVar208 * fVar40;
              auVar93._16_4_ = fVar209 * fVar50;
              auVar93._20_4_ = fVar210 * fVar60;
              auVar93._24_4_ = fVar211 * fVar70;
              auVar93._28_4_ = local_1660._28_4_;
              local_1640 = vsubps_avx(auVar93,auVar92);
              uVar3 = *(undefined4 *)&(ray->org).field_0;
              auVar204._4_4_ = uVar3;
              auVar204._0_4_ = uVar3;
              auVar204._8_4_ = uVar3;
              auVar204._12_4_ = uVar3;
              auVar204._16_4_ = uVar3;
              auVar204._20_4_ = uVar3;
              auVar204._24_4_ = uVar3;
              auVar204._28_4_ = uVar3;
              uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar212._4_4_ = uVar3;
              auVar212._0_4_ = uVar3;
              auVar212._8_4_ = uVar3;
              auVar212._12_4_ = uVar3;
              auVar212._16_4_ = uVar3;
              auVar212._20_4_ = uVar3;
              auVar212._24_4_ = uVar3;
              auVar212._28_4_ = uVar3;
              uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar215._4_4_ = uVar4;
              auVar215._0_4_ = uVar4;
              auVar215._8_4_ = uVar4;
              auVar215._12_4_ = uVar4;
              auVar215._16_4_ = uVar4;
              auVar215._20_4_ = uVar4;
              auVar215._24_4_ = uVar4;
              auVar215._28_4_ = uVar4;
              fVar140 = (ray->dir).field_0.m128[1];
              local_1620 = vsubps_avx(auVar170,auVar204);
              fVar149 = (ray->dir).field_0.m128[2];
              auVar80 = vsubps_avx(auVar173,auVar212);
              auVar81 = vsubps_avx(auVar177,auVar215);
              fVar150 = auVar81._0_4_;
              fVar22 = auVar81._4_4_;
              auVar94._4_4_ = fVar140 * fVar22;
              auVar94._0_4_ = fVar140 * fVar150;
              fVar32 = auVar81._8_4_;
              auVar94._8_4_ = fVar140 * fVar32;
              fVar42 = auVar81._12_4_;
              auVar94._12_4_ = fVar140 * fVar42;
              fVar52 = auVar81._16_4_;
              auVar94._16_4_ = fVar140 * fVar52;
              fVar62 = auVar81._20_4_;
              auVar94._20_4_ = fVar140 * fVar62;
              fVar72 = auVar81._24_4_;
              auVar94._24_4_ = fVar140 * fVar72;
              auVar94._28_4_ = uVar3;
              fVar147 = auVar80._0_4_;
              fVar23 = auVar80._4_4_;
              auVar95._4_4_ = fVar149 * fVar23;
              auVar95._0_4_ = fVar149 * fVar147;
              fVar33 = auVar80._8_4_;
              auVar95._8_4_ = fVar149 * fVar33;
              fVar43 = auVar80._12_4_;
              auVar95._12_4_ = fVar149 * fVar43;
              fVar53 = auVar80._16_4_;
              auVar95._16_4_ = fVar149 * fVar53;
              fVar63 = auVar80._20_4_;
              auVar95._20_4_ = fVar149 * fVar63;
              fVar73 = auVar80._24_4_;
              auVar95._24_4_ = fVar149 * fVar73;
              auVar95._28_4_ = uVar4;
              auVar80 = vsubps_avx(auVar95,auVar94);
              fVar151 = (ray->dir).field_0.m128[0];
              fVar14 = local_1620._0_4_;
              fVar24 = local_1620._4_4_;
              auVar96._4_4_ = fVar149 * fVar24;
              auVar96._0_4_ = fVar149 * fVar14;
              fVar34 = local_1620._8_4_;
              auVar96._8_4_ = fVar149 * fVar34;
              fVar44 = local_1620._12_4_;
              auVar96._12_4_ = fVar149 * fVar44;
              fVar54 = local_1620._16_4_;
              auVar96._16_4_ = fVar149 * fVar54;
              fVar64 = local_1620._20_4_;
              auVar96._20_4_ = fVar149 * fVar64;
              fVar74 = local_1620._24_4_;
              auVar96._24_4_ = fVar149 * fVar74;
              auVar96._28_4_ = uVar89;
              auVar97._4_4_ = fVar151 * fVar22;
              auVar97._0_4_ = fVar151 * fVar150;
              auVar97._8_4_ = fVar151 * fVar32;
              auVar97._12_4_ = fVar151 * fVar42;
              auVar97._16_4_ = fVar151 * fVar52;
              auVar97._20_4_ = fVar151 * fVar62;
              auVar97._24_4_ = fVar151 * fVar72;
              auVar97._28_4_ = auVar180._12_4_;
              auVar81 = vsubps_avx(auVar97,auVar96);
              auVar98._4_4_ = fVar151 * fVar23;
              auVar98._0_4_ = fVar151 * fVar147;
              auVar98._8_4_ = fVar151 * fVar33;
              auVar98._12_4_ = fVar151 * fVar43;
              auVar98._16_4_ = fVar151 * fVar53;
              auVar98._20_4_ = fVar151 * fVar63;
              auVar98._24_4_ = fVar151 * fVar73;
              auVar98._28_4_ = auVar180._12_4_;
              auVar99._4_4_ = fVar140 * fVar24;
              auVar99._0_4_ = fVar140 * fVar14;
              auVar99._8_4_ = fVar140 * fVar34;
              auVar99._12_4_ = fVar140 * fVar44;
              auVar99._16_4_ = fVar140 * fVar54;
              auVar99._20_4_ = fVar140 * fVar64;
              auVar99._24_4_ = fVar140 * fVar74;
              auVar99._28_4_ = local_1620._28_4_;
              auVar82 = vsubps_avx(auVar99,auVar98);
              fVar15 = local_1640._0_4_;
              fVar25 = local_1640._4_4_;
              fVar35 = local_1640._8_4_;
              fVar45 = local_1640._12_4_;
              fVar55 = local_1640._16_4_;
              fVar65 = local_1640._20_4_;
              fVar75 = local_1640._24_4_;
              fVar16 = auVar137._0_4_;
              fVar26 = auVar137._4_4_;
              fVar36 = auVar137._8_4_;
              fVar46 = auVar137._12_4_;
              fVar56 = auVar137._16_4_;
              fVar66 = auVar137._20_4_;
              fVar76 = auVar137._24_4_;
              auVar166 = ZEXT3264(local_1600);
              fVar17 = local_1600._0_4_;
              fVar27 = local_1600._4_4_;
              fVar37 = local_1600._8_4_;
              fVar47 = local_1600._12_4_;
              fVar57 = local_1600._16_4_;
              fVar67 = local_1600._20_4_;
              fVar77 = local_1600._24_4_;
              auVar162._0_4_ = fVar151 * fVar17 + fVar140 * fVar16 + fVar149 * fVar15;
              auVar162._4_4_ = fVar151 * fVar27 + fVar140 * fVar26 + fVar149 * fVar25;
              auVar162._8_4_ = fVar151 * fVar37 + fVar140 * fVar36 + fVar149 * fVar35;
              auVar162._12_4_ = fVar151 * fVar47 + fVar140 * fVar46 + fVar149 * fVar45;
              auVar162._16_4_ = fVar151 * fVar57 + fVar140 * fVar56 + fVar149 * fVar55;
              auVar162._20_4_ = fVar151 * fVar67 + fVar140 * fVar66 + fVar149 * fVar65;
              auVar162._24_4_ = fVar151 * fVar77 + fVar140 * fVar76 + fVar149 * fVar75;
              auVar162._28_4_ = fVar149 + fVar149 + local_1620._28_4_;
              auVar163 = ZEXT3264(auVar162);
              auVar143._8_4_ = 0x80000000;
              auVar143._0_8_ = 0x8000000080000000;
              auVar143._12_4_ = 0x80000000;
              auVar143._16_4_ = 0x80000000;
              auVar143._20_4_ = 0x80000000;
              auVar143._24_4_ = 0x80000000;
              auVar143._28_4_ = 0x80000000;
              auVar137 = vandps_avx(auVar162,auVar143);
              uVar120 = auVar137._0_4_;
              auVar175._0_4_ =
                   (float)(uVar120 ^
                          (uint)(fVar154 * auVar80._0_4_ +
                                fVar153 * auVar81._0_4_ + fVar152 * auVar82._0_4_));
              uVar192 = auVar137._4_4_;
              auVar175._4_4_ =
                   (float)(uVar192 ^
                          (uint)(fVar20 * auVar80._4_4_ +
                                fVar19 * auVar81._4_4_ + fVar18 * auVar82._4_4_));
              uVar193 = auVar137._8_4_;
              auVar175._8_4_ =
                   (float)(uVar193 ^
                          (uint)(fVar30 * auVar80._8_4_ +
                                fVar29 * auVar81._8_4_ + fVar28 * auVar82._8_4_));
              uVar194 = auVar137._12_4_;
              auVar175._12_4_ =
                   (float)(uVar194 ^
                          (uint)(fVar40 * auVar80._12_4_ +
                                fVar39 * auVar81._12_4_ + fVar38 * auVar82._12_4_));
              uVar195 = auVar137._16_4_;
              auVar175._16_4_ =
                   (float)(uVar195 ^
                          (uint)(fVar50 * auVar80._16_4_ +
                                fVar49 * auVar81._16_4_ + fVar48 * auVar82._16_4_));
              uVar196 = auVar137._20_4_;
              auVar175._20_4_ =
                   (float)(uVar196 ^
                          (uint)(fVar60 * auVar80._20_4_ +
                                fVar59 * auVar81._20_4_ + fVar58 * auVar82._20_4_));
              uVar197 = auVar137._24_4_;
              auVar175._24_4_ =
                   (float)(uVar197 ^
                          (uint)(fVar70 * auVar80._24_4_ +
                                fVar69 * auVar81._24_4_ + fVar68 * auVar82._24_4_));
              uVar198 = auVar137._28_4_;
              auVar175._28_4_ =
                   (float)(uVar198 ^ (uint)(auVar158._28_4_ + auVar78._28_4_ + auVar79._28_4_));
              auVar182._0_4_ =
                   (float)(uVar120 ^
                          (uint)(auVar80._0_4_ * fVar148 +
                                auVar81._0_4_ * fVar202 + fVar179 * auVar82._0_4_));
              auVar182._4_4_ =
                   (float)(uVar192 ^
                          (uint)(auVar80._4_4_ * fVar21 +
                                auVar81._4_4_ * fVar206 + fVar184 * auVar82._4_4_));
              auVar182._8_4_ =
                   (float)(uVar193 ^
                          (uint)(auVar80._8_4_ * fVar31 +
                                auVar81._8_4_ * fVar207 + fVar185 * auVar82._8_4_));
              auVar182._12_4_ =
                   (float)(uVar194 ^
                          (uint)(auVar80._12_4_ * fVar41 +
                                auVar81._12_4_ * fVar208 + fVar186 * auVar82._12_4_));
              auVar182._16_4_ =
                   (float)(uVar195 ^
                          (uint)(auVar80._16_4_ * fVar51 +
                                auVar81._16_4_ * fVar209 + fVar187 * auVar82._16_4_));
              auVar182._20_4_ =
                   (float)(uVar196 ^
                          (uint)(auVar80._20_4_ * fVar61 +
                                auVar81._20_4_ * fVar210 + fVar188 * auVar82._20_4_));
              auVar182._24_4_ =
                   (float)(uVar197 ^
                          (uint)(auVar80._24_4_ * fVar71 +
                                auVar81._24_4_ * fVar211 + fVar189 * auVar82._24_4_));
              auVar182._28_4_ = (float)(uVar198 ^ (uint)(auVar81._28_4_ + auVar82._28_4_ + -0.0));
              auVar158 = ZEXT1232(ZEXT412(0)) << 0x20;
              auVar137 = vcmpps_avx(auVar175,auVar158,5);
              auVar158 = vcmpps_avx(auVar182,auVar158,5);
              auVar137 = vandps_avx(auVar137,auVar158);
              auVar144._8_4_ = 0x7fffffff;
              auVar144._0_8_ = 0x7fffffff7fffffff;
              auVar144._12_4_ = 0x7fffffff;
              auVar144._16_4_ = 0x7fffffff;
              auVar144._20_4_ = 0x7fffffff;
              auVar144._24_4_ = 0x7fffffff;
              auVar144._28_4_ = 0x7fffffff;
              local_1320 = vandps_avx(auVar162,auVar144);
              auVar172 = ZEXT3264(local_1320);
              auVar158 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar162,4);
              auVar137 = vandps_avx(auVar137,auVar158);
              auVar145._0_4_ = auVar182._0_4_ + auVar175._0_4_;
              auVar145._4_4_ = auVar182._4_4_ + auVar175._4_4_;
              auVar145._8_4_ = auVar182._8_4_ + auVar175._8_4_;
              auVar145._12_4_ = auVar182._12_4_ + auVar175._12_4_;
              auVar145._16_4_ = auVar182._16_4_ + auVar175._16_4_;
              auVar145._20_4_ = auVar182._20_4_ + auVar175._20_4_;
              auVar145._24_4_ = auVar182._24_4_ + auVar175._24_4_;
              auVar145._28_4_ = auVar182._28_4_ + auVar175._28_4_;
              auVar78 = vcmpps_avx(auVar145,local_1320,2);
              auVar146 = ZEXT3264(auVar78);
              auVar158 = vandps_avx(auVar137,auVar78);
              auVar79 = local_1420 & auVar158;
              if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar79 >> 0x7f,0) != '\0') ||
                    (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar79 >> 0xbf,0) != '\0') ||
                  (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar79[0x1f] < '\0') {
                auVar158 = vandps_avx(auVar158,local_1420);
                local_1340._0_4_ =
                     (float)(uVar120 ^ (uint)(fVar17 * fVar14 + fVar16 * fVar147 + fVar150 * fVar15)
                            );
                local_1340._4_4_ =
                     (float)(uVar192 ^ (uint)(fVar27 * fVar24 + fVar26 * fVar23 + fVar22 * fVar25));
                local_1340._8_4_ =
                     (float)(uVar193 ^ (uint)(fVar37 * fVar34 + fVar36 * fVar33 + fVar32 * fVar35));
                local_1340._12_4_ =
                     (float)(uVar194 ^ (uint)(fVar47 * fVar44 + fVar46 * fVar43 + fVar42 * fVar45));
                local_1340._16_4_ =
                     (float)(uVar195 ^ (uint)(fVar57 * fVar54 + fVar56 * fVar53 + fVar52 * fVar55));
                local_1340._20_4_ =
                     (float)(uVar196 ^ (uint)(fVar67 * fVar64 + fVar66 * fVar63 + fVar62 * fVar65));
                local_1340._24_4_ =
                     (float)(uVar197 ^ (uint)(fVar77 * fVar74 + fVar76 * fVar73 + fVar72 * fVar75));
                local_1340._28_4_ =
                     uVar198 ^ (uint)(auVar78._28_4_ + auVar78._28_4_ + auVar137._28_4_);
                auVar166 = ZEXT3264(local_1340);
                fVar140 = (ray->org).field_0.m128[3];
                fVar149 = local_1320._0_4_;
                fVar151 = local_1320._4_4_;
                auVar100._4_4_ = fVar151 * fVar140;
                auVar100._0_4_ = fVar149 * fVar140;
                fVar152 = local_1320._8_4_;
                auVar100._8_4_ = fVar152 * fVar140;
                fVar153 = local_1320._12_4_;
                auVar100._12_4_ = fVar153 * fVar140;
                fVar154 = local_1320._16_4_;
                auVar100._16_4_ = fVar154 * fVar140;
                fVar148 = local_1320._20_4_;
                auVar100._20_4_ = fVar148 * fVar140;
                fVar150 = local_1320._24_4_;
                auVar100._24_4_ = fVar150 * fVar140;
                auVar100._28_4_ = fVar140;
                auVar137 = vcmpps_avx(auVar100,local_1340,1);
                fVar140 = ray->tfar;
                auVar101._4_4_ = fVar151 * fVar140;
                auVar101._0_4_ = fVar149 * fVar140;
                auVar101._8_4_ = fVar152 * fVar140;
                auVar101._12_4_ = fVar153 * fVar140;
                auVar101._16_4_ = fVar154 * fVar140;
                auVar101._20_4_ = fVar148 * fVar140;
                auVar101._24_4_ = fVar150 * fVar140;
                auVar101._28_4_ = fVar140;
                auVar78 = vcmpps_avx(local_1340,auVar101,2);
                auVar146 = ZEXT3264(auVar78);
                auVar137 = vandps_avx(auVar78,auVar137);
                auVar78 = auVar158 & auVar137;
                if ((((((((auVar78 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar78 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar78 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar78 >> 0x7f,0) != '\0') ||
                      (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar78 >> 0xbf,0) != '\0') ||
                    (auVar78 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar78[0x1f] < '\0') {
                  local_12e0 = vandps_avx(auVar158,auVar137);
                  auVar137 = vsubps_avx(local_1320,auVar182);
                  local_1380 = vblendvps_avx(auVar175,auVar137,local_13e0);
                  auVar137 = vsubps_avx(local_1320,auVar175);
                  local_1360 = vblendvps_avx(auVar182,auVar137,local_13e0);
                  local_1260[0] = fVar17 * (float)local_1400._0_4_;
                  local_1260[1] = fVar27 * (float)local_1400._4_4_;
                  local_1260[2] = fVar37 * fStack_13f8;
                  local_1260[3] = fVar47 * fStack_13f4;
                  fStack_1250 = fVar57 * fStack_13f0;
                  fStack_124c = fVar67 * fStack_13ec;
                  fStack_1248 = fVar77 * fStack_13e8;
                  fStack_1244 = auVar182._28_4_;
                  local_1240[0] = fVar16 * (float)local_1400._0_4_;
                  local_1240[1] = fVar26 * (float)local_1400._4_4_;
                  local_1240[2] = fVar36 * fStack_13f8;
                  local_1240[3] = fVar46 * fStack_13f4;
                  fStack_1230 = fVar56 * fStack_13f0;
                  fStack_122c = fVar66 * fStack_13ec;
                  fStack_1228 = fVar76 * fStack_13e8;
                  fStack_1224 = auVar182._28_4_;
                  auVar137 = vrcpps_avx(local_1320);
                  local_1220[0] = (float)local_1400._0_4_ * fVar15;
                  local_1220[1] = (float)local_1400._4_4_ * fVar25;
                  local_1220[2] = fStack_13f8 * fVar35;
                  local_1220[3] = fStack_13f4 * fVar45;
                  fStack_1210 = fStack_13f0 * fVar55;
                  fStack_120c = fStack_13ec * fVar65;
                  fStack_1208 = fStack_13e8 * fVar75;
                  uStack_1204 = uStack_13e4;
                  fVar140 = auVar137._0_4_;
                  fVar147 = auVar137._4_4_;
                  auVar102._4_4_ = fVar151 * fVar147;
                  auVar102._0_4_ = fVar149 * fVar140;
                  fVar149 = auVar137._8_4_;
                  auVar102._8_4_ = fVar152 * fVar149;
                  fVar151 = auVar137._12_4_;
                  auVar102._12_4_ = fVar153 * fVar151;
                  fVar152 = auVar137._16_4_;
                  auVar102._16_4_ = fVar154 * fVar152;
                  fVar153 = auVar137._20_4_;
                  auVar102._20_4_ = fVar148 * fVar153;
                  fVar154 = auVar137._24_4_;
                  auVar102._24_4_ = fVar150 * fVar154;
                  auVar102._28_4_ = uStack_13e4;
                  auVar171._8_4_ = 0x3f800000;
                  auVar171._0_8_ = &DAT_3f8000003f800000;
                  auVar171._12_4_ = 0x3f800000;
                  auVar171._16_4_ = 0x3f800000;
                  auVar171._20_4_ = 0x3f800000;
                  auVar171._24_4_ = 0x3f800000;
                  auVar171._28_4_ = 0x3f800000;
                  auVar172 = ZEXT3264(auVar171);
                  auVar158 = vsubps_avx(auVar171,auVar102);
                  fVar140 = fVar140 + fVar140 * auVar158._0_4_;
                  fVar147 = fVar147 + fVar147 * auVar158._4_4_;
                  fVar149 = fVar149 + fVar149 * auVar158._8_4_;
                  fVar151 = fVar151 + fVar151 * auVar158._12_4_;
                  fVar152 = fVar152 + fVar152 * auVar158._16_4_;
                  fVar153 = fVar153 + fVar153 * auVar158._20_4_;
                  fVar154 = fVar154 + fVar154 * auVar158._24_4_;
                  auVar146 = ZEXT3264(CONCAT428(auVar137._28_4_ + auVar158._28_4_,
                                                CONCAT424(fVar154,CONCAT420(fVar153,CONCAT416(
                                                  fVar152,CONCAT412(fVar151,CONCAT48(fVar149,
                                                  CONCAT44(fVar147,fVar140))))))));
                  local_1280._4_4_ = fVar147 * local_1340._4_4_;
                  local_1280._0_4_ = fVar140 * local_1340._0_4_;
                  local_1280._8_4_ = fVar149 * local_1340._8_4_;
                  local_1280._12_4_ = fVar151 * local_1340._12_4_;
                  local_1280._16_4_ = fVar152 * local_1340._16_4_;
                  local_1280._20_4_ = fVar153 * local_1340._20_4_;
                  local_1280._24_4_ = fVar154 * local_1340._24_4_;
                  local_1280._28_4_ = auVar158._28_4_;
                  auVar166 = ZEXT3264(local_1280);
                  local_12c0._4_4_ = local_1380._4_4_ * fVar147;
                  local_12c0._0_4_ = local_1380._0_4_ * fVar140;
                  local_12c0._8_4_ = local_1380._8_4_ * fVar149;
                  local_12c0._12_4_ = local_1380._12_4_ * fVar151;
                  local_12c0._16_4_ = local_1380._16_4_ * fVar152;
                  local_12c0._20_4_ = local_1380._20_4_ * fVar153;
                  local_12c0._24_4_ = local_1380._24_4_ * fVar154;
                  local_12c0._28_4_ = local_1380._28_4_;
                  auVar163 = ZEXT3264(local_12c0);
                  local_12a0[0] = local_1360._0_4_ * fVar140;
                  local_12a0[1] = local_1360._4_4_ * fVar147;
                  local_12a0[2] = local_1360._8_4_ * fVar149;
                  local_12a0[3] = local_1360._12_4_ * fVar151;
                  fStack_1290 = local_1360._16_4_ * fVar152;
                  fStack_128c = local_1360._20_4_ * fVar153;
                  fStack_1288 = local_1360._24_4_ * fVar154;
                  uStack_1284 = local_1360._28_4_;
                  uVar120 = vmovmskps_avx(local_12e0);
                  uVar122 = (ulong)uVar120;
                  _local_15e0 = auVar104;
                  _local_15d0 = auVar105;
                  _local_15c0 = auVar106;
                  _local_15b0 = auVar107;
                  _local_15a0 = auVar108;
                  _local_1590 = auVar109;
                  _local_1580 = auVar110;
                  _local_1570 = auVar111;
                  _local_1560 = auVar112;
                  _local_1550 = auVar113;
                  _local_1540 = auVar114;
                  do {
                    uVar124 = 0;
                    if (uVar122 != 0) {
                      for (; (uVar122 >> uVar124 & 1) == 0; uVar124 = uVar124 + 1) {
                      }
                    }
                    local_16a8 = *(uint *)((long)&local_13a0 + uVar124 * 4);
                    pGVar9 = (local_1728->geometries).items[local_16a8].ptr;
                    if ((pGVar9->mask & ray->mask) == 0) {
                      uVar122 = uVar122 ^ 1L << (uVar124 & 0x3f);
                      bVar103 = true;
                    }
                    else {
                      pRVar12 = context->args;
                      if ((pRVar12->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar103 = false;
                      }
                      else {
                        local_1720._0_8_ = uVar122;
                        auVar146 = ZEXT464((uint)local_12a0[uVar124]);
                        local_1690.context = context->user;
                        local_16c0 = local_1260[uVar124];
                        auVar163 = ZEXT464((uint)local_16c0);
                        local_16bc = local_1240[uVar124];
                        auVar166 = ZEXT464((uint)local_16bc);
                        local_16b8 = local_1220[uVar124];
                        auVar172 = ZEXT464((uint)local_16b8);
                        local_16b4 = local_12a0[uVar124 - 8];
                        local_16b0 = local_12a0[uVar124];
                        local_16ac = *(undefined4 *)((long)&local_13c0 + uVar124 * 4);
                        local_16a4 = (local_1690.context)->instID[0];
                        local_16a0 = (local_1690.context)->instPrimID[0];
                        local_1660._0_4_ = ray->tfar;
                        ray->tfar = local_1260[uVar124 - 8];
                        local_176c = -1;
                        local_1690.valid = &local_176c;
                        local_1690.geometryUserPtr = pGVar9->userPtr;
                        local_1690.ray = (RTCRayN *)ray;
                        local_1690.hit = (RTCHitN *)&local_16c0;
                        local_1690.N = 1;
                        if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0030e058:
                          if (pRVar12->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar12->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                              auVar163 = ZEXT1664(auVar163._0_16_);
                              auVar166 = ZEXT1664(auVar166._0_16_);
                              auVar172 = ZEXT1664(auVar172._0_16_);
                              (*pRVar12->filter)(&local_1690);
                              auVar146._8_56_ = extraout_var_00;
                              auVar146._0_8_ = extraout_XMM1_Qa_00;
                            }
                            if (*local_1690.valid == 0) goto LAB_0030e08d;
                          }
                          bVar103 = false;
                        }
                        else {
                          auVar163 = ZEXT464((uint)local_16c0);
                          auVar166 = ZEXT464((uint)local_16bc);
                          auVar172 = ZEXT464((uint)local_16b8);
                          (*pGVar9->occlusionFilterN)(&local_1690);
                          auVar146._8_56_ = extraout_var;
                          auVar146._0_8_ = extraout_XMM1_Qa;
                          if (*local_1690.valid != 0) goto LAB_0030e058;
LAB_0030e08d:
                          ray->tfar = (float)local_1660._0_4_;
                          local_1720._0_8_ = local_1720._0_8_ ^ 1L << (uVar124 & 0x3f);
                          bVar103 = true;
                        }
                        uVar122 = local_1720._0_8_;
                      }
                    }
                    if (!bVar103) {
                      auVar174 = ZEXT1664(ZEXT816(0) << 0x40);
                      auVar176 = ZEXT3264(local_1440);
                      auVar178 = ZEXT3264(local_1460);
                      auVar183 = ZEXT3264(local_1480);
                      auVar191 = ZEXT3264(local_14a0);
                      auVar200 = ZEXT3264(local_14c0);
                      auVar201 = ZEXT3264(local_14e0);
                      auVar205 = ZEXT3264(local_1500);
                      auVar213 = ZEXT3264(local_1520);
                      iVar118 = 0;
                      uVar123 = local_1760;
                      uVar122 = local_1740;
                      uVar124 = local_1748;
                      uVar126 = local_1750;
                      uVar128 = local_1758;
                      uVar133 = local_1768;
                      if (bVar134) {
                        ray->tfar = -INFINITY;
                        iVar118 = 3;
                      }
                      goto LAB_0030e142;
                    }
                  } while (uVar122 != 0);
                }
              }
              uVar123 = uVar123 + 1;
              bVar134 = uVar123 < local_16f8;
              auVar174 = ZEXT1664(ZEXT816(0) << 0x40);
            } while (uVar123 != local_16f8);
            auVar176 = ZEXT3264(local_1440);
            auVar178 = ZEXT3264(local_1460);
            auVar183 = ZEXT3264(local_1480);
            auVar191 = ZEXT3264(local_14a0);
            auVar200 = ZEXT3264(local_14c0);
            auVar201 = ZEXT3264(local_14e0);
            auVar205 = ZEXT3264(local_1500);
            auVar213 = ZEXT3264(local_1520);
            iVar118 = 0;
            uVar123 = local_1760;
            uVar122 = local_1740;
            uVar124 = local_1748;
            uVar126 = local_1750;
            uVar128 = local_1758;
            uVar133 = local_1768;
          }
        }
LAB_0030e142:
        unaff_R13 = local_1738;
      } while (iVar118 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }